

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_object_isSealed(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int is_frozen)

{
  int64_t iVar1;
  int iVar2;
  JSValueUnion JVar3;
  ulong uVar4;
  JSValue obj;
  JSValue JVar5;
  JSValueUnion JStack_90;
  uint32_t len;
  int64_t local_78;
  JSPropertyEnum *props;
  JSPropertyDescriptor desc;
  
  iVar1 = argv->tag;
  JStack_90.float64 = 4.94065645841247e-324;
  JVar3.float64 = JStack_90.float64;
  if ((int)iVar1 == -1) {
    JVar3 = (JSValueUnion)(argv->u).ptr;
    iVar2 = JS_GetOwnPropertyNamesInternal(ctx,&props,&len,(JSObject *)JVar3.ptr,3);
    JStack_90.float64 = 2.96439387504748e-323;
    if (iVar2 == 0) {
      local_78 = iVar1;
      for (uVar4 = 0; len != uVar4; uVar4 = uVar4 + 1) {
        iVar2 = JS_GetOwnPropertyInternal(ctx,&desc,(JSObject *)JVar3.ptr,props[uVar4].atom);
        if (iVar2 < 0) {
          js_free_prop_enum(ctx,props,len);
          goto LAB_00152604;
        }
        if ((iVar2 != 0) &&
           ((js_free_desc(ctx,&desc), (desc.flags & 1U) != 0 ||
            ((desc.flags & 2U) != 0 && is_frozen != 0)))) {
          JVar3.float64 = 0.0;
          goto LAB_001525e4;
        }
      }
      obj.tag = local_78;
      obj.u.ptr = JVar3.ptr;
      iVar2 = JS_IsExtensible(ctx,obj);
      if (iVar2 < 0) {
LAB_00152604:
        JVar3.float64 = 0.0;
        JStack_90.float64 = 2.96439387504748e-323;
      }
      else {
        JVar3._1_7_ = 0;
        JVar3.int32._0_1_ = iVar2 != 1;
LAB_001525e4:
        js_free_prop_enum(ctx,props,len);
        JStack_90.float64 = 4.94065645841247e-324;
      }
    }
    else {
      JVar3.float64 = 0.0;
    }
  }
  JVar5.tag = (int64_t)JStack_90.ptr;
  JVar5.u.float64 = JVar3.float64;
  return JVar5;
}

Assistant:

static JSValue js_object_isSealed(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv, int is_frozen)
{
    JSValueConst obj = argv[0];
    JSObject *p;
    JSPropertyEnum *props;
    uint32_t len, i;
    int flags, res;
    
    if (!JS_IsObject(obj))
        return JS_TRUE;

    p = JS_VALUE_GET_OBJ(obj);
    flags = JS_GPN_STRING_MASK | JS_GPN_SYMBOL_MASK;
    if (JS_GetOwnPropertyNamesInternal(ctx, &props, &len, p, flags))
        return JS_EXCEPTION;

    for(i = 0; i < len; i++) {
        JSPropertyDescriptor desc;
        JSAtom prop = props[i].atom;

        res = JS_GetOwnPropertyInternal(ctx, &desc, p, prop);
        if (res < 0)
            goto exception;
        if (res) {
            js_free_desc(ctx, &desc);
            if ((desc.flags & JS_PROP_CONFIGURABLE)
            ||  (is_frozen && (desc.flags & JS_PROP_WRITABLE))) {
                res = FALSE;
                goto done;
            }
        }
    }
    res = JS_IsExtensible(ctx, obj);
    if (res < 0)
        return JS_EXCEPTION;
    res ^= 1;
done:        
    js_free_prop_enum(ctx, props, len);
    return JS_NewBool(ctx, res);

exception:
    js_free_prop_enum(ctx, props, len);
    return JS_EXCEPTION;
}